

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_mbox_core_stats.cpp
# Opt level: O1

void __thiscall
so_5::stats::impl::ds_mbox_core_stats_t::distribute
          (ds_mbox_core_stats_t *this,mbox_t *distribution_mbox)

{
  mbox_core_stats_t stats;
  suffix_t local_58;
  size_t local_50;
  prefix_t local_48;
  
  local_50 = (size_t)so_5::impl::mbox_core_t::query_stats(this->m_what);
  prefixes::mbox_repository();
  local_58 = suffixes::named_mbox_count();
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t,so_5::stats::suffix_t,unsigned_long&>
            (distribution_mbox,&local_48,&local_58,&local_50);
  return;
}

Assistant:

void
ds_mbox_core_stats_t::distribute(
	const mbox_t & distribution_mbox )
	{
		auto stats = m_what.query_stats();

		send< messages::quantity< std::size_t > >( distribution_mbox,
				prefixes::mbox_repository(),
				suffixes::named_mbox_count(),
				stats.m_named_mbox_count );
	}